

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O3

void __thiscall
OpenMD::NameFinder::matchInternalIndex
          (NameFinder *this,string *name,int internalIndex,SelectionSet *bs)

{
  ulong *puVar1;
  pointer pcVar2;
  pointer ppAVar3;
  int iVar4;
  Molecule *pMVar5;
  pointer ppRVar6;
  int iVar7;
  MoleculeIterator mi;
  long *local_58 [2];
  long local_48 [2];
  MoleculeIterator local_38;
  
  local_38._M_node = (_Base_ptr)0x0;
  pMVar5 = SimInfo::beginMolecule(this->info_,&local_38);
  if (pMVar5 != (Molecule *)0x0) {
    do {
      pcVar2 = (pMVar5->molStamp_->Name).data_._M_dataplus._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar2,pcVar2 + (pMVar5->molStamp_->Name).data_._M_string_length
                );
      iVar4 = Wildcard::wildcardfit((name->_M_dataplus)._M_p,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if (0 < iVar4) {
        ppAVar3 = (pMVar5->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppRVar6 = (pMVar5->rigidBodies_).
                  super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        iVar4 = (int)((ulong)((long)(pMVar5->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar3) >> 3
                     );
        if (internalIndex <
            (int)((ulong)((long)(pMVar5->rigidBodies_).
                                super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar6) >> 3) +
            iVar4) {
          ppRVar6 = ppRVar6 + (uint)(internalIndex - iVar4);
          if (internalIndex < iVar4) {
            ppRVar6 = (pointer)(ppAVar3 + (uint)internalIndex);
          }
          iVar4 = ((*ppRVar6)->super_StuntDouble).globalIndex_;
          iVar7 = iVar4 + 0x3f;
          if (-1 < (long)iVar4) {
            iVar7 = iVar4;
          }
          puVar1 = (ulong *)((long)(iVar7 >> 6) * 8 +
                             *(long *)&(((bs->bitsets_).
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                       super__Bvector_base<std::allocator<bool>_> + -8 +
                            (ulong)(((long)iVar4 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar4 & 0x3f);
        }
      }
      pMVar5 = SimInfo::nextMolecule(this->info_,&local_38);
    } while (pMVar5 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void NameFinder::matchInternalIndex(const std::string& name,
                                      int internalIndex, SelectionSet& bs) {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      if (isMatched(mol->getType(), name)) {
        int natoms       = mol->getNAtoms();
        int nrigidbodies = mol->getNRigidBodies();
        if (internalIndex >= natoms + nrigidbodies) {
          continue;
        } else if (internalIndex < natoms) {
          bs.bitsets_[STUNTDOUBLE].setBitOn(
              mol->getAtomAt(internalIndex)->getGlobalIndex());
          continue;
        } else if (internalIndex < natoms + nrigidbodies) {
          bs.bitsets_[STUNTDOUBLE].setBitOn(
              mol->getRigidBodyAt(internalIndex - natoms)->getGlobalIndex());
        }
      }
    }
  }